

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem.cpp
# Opt level: O2

void __thiscall MppMemService::~MppMemService(MppMemService *this)

{
  pthread_mutex_t *__mutex;
  void **ppvVar1;
  int iVar2;
  MppMemNode *pMVar3;
  undefined8 in_stack_ffffffffffffffa8;
  AutoMutex auto_lock;
  size_t local_38;
  
  if ((this->debug & 1) != 0) {
    auto_lock.mLock = this->m_lock;
    auto_lock.mEnabled = 1;
    if ((pthread_mutex_t *)auto_lock.mLock != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)auto_lock.mLock);
    }
    pMVar3 = this->nodes;
    del_node(this,"~MppMemService",this,&local_38);
    del_node(this,"~MppMemService",this->nodes,&local_38);
    del_node(this,"~MppMemService",this->frees,&local_38);
    del_node(this,"~MppMemService",this->logs,&local_38);
    if (this->nodes_cnt != 0) {
      ppvVar1 = &pMVar3->ptr;
      for (iVar2 = 0; iVar2 < this->nodes_max; iVar2 = iVar2 + 1) {
        if (-1 < ((MppMemNode *)(ppvVar1 + -2))->index) {
          _mpp_log_l(4,"mpp_mem","found idx %8d mem %10p size %d leaked\n",(char *)0x0,
                     (ulong)(uint)((MppMemNode *)(ppvVar1 + -2))->index,*ppvVar1,ppvVar1[-1]);
          this->nodes_cnt = this->nodes_cnt + -1;
          in_stack_ffffffffffffffa8 = 0;
          add_log(this,MEM_FREE,"~MppMemService",*ppvVar1,(void *)0x0,(size_t)ppvVar1[-1],0);
        }
        ppvVar1 = ppvVar1 + 4;
      }
      if (this->nodes_cnt != 0) {
        in_stack_ffffffffffffffa8 = CONCAT44((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),0x117);
        _mpp_log_l(2,"mpp_mem","Assertion %s failed at %s:%d\n",(char *)0x0,"nodes_cnt == 0",
                   "~MppMemService",in_stack_ffffffffffffffa8);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0011aacf;
      }
    }
    if (this->frees_cnt != 0) {
      pMVar3 = this->frees;
      for (iVar2 = 0; iVar2 < this->frees_max; iVar2 = iVar2 + 1) {
        if (-1 < pMVar3->index) {
          os_free((void *)((long)pMVar3->ptr - (ulong)(this->debug * 2 & 0x20)));
          pMVar3->index = ~pMVar3->index;
          this->frees_cnt = this->frees_cnt + -1;
          in_stack_ffffffffffffffa8 = 0;
          add_log(this,MEM_FREE_DELAY,"~MppMemService",pMVar3->ptr,(void *)0x0,pMVar3->size,0);
        }
        pMVar3 = pMVar3 + 1;
      }
      if (this->frees_cnt != 0) {
        _mpp_log_l(2,"mpp_mem","Assertion %s failed at %s:%d\n",(char *)0x0,"frees_cnt == 0",
                   "~MppMemService",CONCAT44((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),0x128))
        ;
        if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_0011aacf:
          abort();
        }
      }
    }
    os_free(this->nodes);
    os_free(this->frees);
    os_free(this->logs);
    Mutex::Autolock::~Autolock(&auto_lock);
  }
  __mutex = (pthread_mutex_t *)this->m_lock;
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_destroy(__mutex);
    operator_delete(__mutex,0x28);
    this->m_lock = (Mutex *)0x0;
  }
  return;
}

Assistant:

MppMemService::~MppMemService()
{
    if (debug & MEM_DEBUG_EN) {
        AutoMutex auto_lock(m_lock);

        RK_S32 i = 0;
        MppMemNode *node = nodes;

        // delete self node first
        size_t size = 0;

        del_node(__FUNCTION__, this,  &size);
        del_node(__FUNCTION__, nodes, &size);
        del_node(__FUNCTION__, frees, &size);
        del_node(__FUNCTION__, logs,  &size);

        // then check leak memory
        if (nodes_cnt) {
            for (i = 0; i < nodes_max; i++, node++) {
                if (node->index >= 0) {
                    mpp_log("found idx %8d mem %10p size %d leaked\n",
                            node->index, node->ptr, node->size);
                    nodes_cnt--;
                    add_log(MEM_FREE, __FUNCTION__, node->ptr, NULL,
                            node->size, 0);
                }
            }

            mpp_assert(nodes_cnt == 0);
        }

        // finally release all delay free memory
        if (frees_cnt) {
            node = frees;

            for (i = 0; i < frees_max; i++, node++) {
                if (node->index >= 0) {
                    os_free((RK_U8 *)node->ptr - MEM_HEAD_ROOM(debug));
                    node->index = ~node->index;
                    frees_cnt--;
                    add_log(MEM_FREE_DELAY, __FUNCTION__, node->ptr, NULL,
                            node->size, 0);
                }
            }

            mpp_assert(frees_cnt == 0);
        }

        os_free(nodes);
        os_free(frees);
        os_free(logs);
    }

    if (m_lock) {
        delete m_lock;
        m_lock = NULL;
    }
}